

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest_CopyTo_Test::
~AllowUnknownDependenciesTest_CopyTo_Test(AllowUnknownDependenciesTest_CopyTo_Test *this)

{
  ~AllowUnknownDependenciesTest_CopyTo_Test
            ((AllowUnknownDependenciesTest_CopyTo_Test *)
             &this[-1].super_AllowUnknownDependenciesTest.db_.files_to_delete_.
              super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST_P(AllowUnknownDependenciesTest, CopyTo) {
  // FieldDescriptor::CopyTo() should write non-fully-qualified type names
  // for placeholder types which were not originally fully-qualified.
  FieldDescriptorProto proto;

  // Bar is not a placeholder, so it is fully-qualified.
  bar_field_->CopyTo(&proto);
  EXPECT_EQ(".Bar", proto.type_name());
  EXPECT_EQ(FieldDescriptorProto::TYPE_MESSAGE, proto.type());

  // Baz is an unqualified placeholder.
  proto.Clear();
  baz_field_->CopyTo(&proto);
  EXPECT_EQ("Baz", proto.type_name());
  EXPECT_FALSE(proto.has_type());

  // Moo is a fully-qualified placeholder.
  proto.Clear();
  moo_field_->CopyTo(&proto);
  EXPECT_EQ(".corge.Moo", proto.type_name());
  EXPECT_EQ(FieldDescriptorProto::TYPE_ENUM, proto.type());
}